

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.hxx
# Opt level: O2

void __thiscall
cornerstone::
async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>::
set_result<std::shared_ptr<cornerstone::resp_msg>&,std::shared_ptr<cornerstone::rpc_exception>>
          (async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>
           *this,shared_ptr<cornerstone::resp_msg> *result,
          shared_ptr<cornerstone::rpc_exception> *err)

{
  handler_type handler;
  _Any_data local_48;
  long local_38;
  undefined8 uStack_30;
  
  local_38 = 0;
  uStack_30 = 0;
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  std::mutex::lock((mutex *)&((pthread_mutex_t *)(this + 0x48))->__data);
  std::__shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2> *)this,
             &result->super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>);
  std::__shared_ptr<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2> *)(this + 0x10),
             &err->super___shared_ptr<cornerstone::rpc_exception,_(__gnu_cxx::_Lock_policy)2>);
  this[0x20] = (async_result<std::shared_ptr<cornerstone::resp_msg>,std::shared_ptr<cornerstone::rpc_exception>>
                )0x1;
  if (*(long *)(this + 0x38) != 0) {
    std::
    function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
    ::operator=((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
                 *)&local_48,
                (function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
                 *)(this + 0x28));
  }
  pthread_mutex_unlock((pthread_mutex_t *)(this + 0x48));
  if (local_38 != 0) {
    std::
    function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
    ::operator()((function<void_(std::shared_ptr<cornerstone::resp_msg>_&,_const_std::shared_ptr<cornerstone::rpc_exception>_&)>
                  *)&local_48,(shared_ptr<cornerstone::resp_msg> *)this,
                 (shared_ptr<cornerstone::rpc_exception> *)(this + 0x10));
  }
  std::condition_variable::notify_all();
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void set_result(_TResult&& result, _TException&& err)
    {
        handler_type handler;
        {
            std::lock_guard<std::mutex> guard(lock_);
            result_ = std::forward<_TResult>(result);
            err_ = std::forward<_TException>(err);
            has_result_ = true;
            if (handler_)
            {
                handler = handler_; // copy handler as std::function assignment is not atomic guaranteed
            }
        }

        if (handler)
        {
            handler(result_, err_);
        }

        cv_.notify_all();
    }